

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O2

uint32_t FAudioCreateReverb(FAPO **ppApo,uint32_t Flags)

{
  FAudioCreateReverbWithCustomAllocatorEXT(ppApo,Flags,SDL_malloc,SDL_free,SDL_realloc);
  return 0;
}

Assistant:

uint32_t FAudioCreateReverb(FAPO** ppApo, uint32_t Flags)
{
	return FAudioCreateReverbWithCustomAllocatorEXT(
		ppApo,
		Flags,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}